

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat.h
# Opt level: O0

Clause * __thiscall SAT::getExpl(SAT *this,Lit p)

{
  uint *puVar1;
  uint uVar2;
  uint index;
  Lit LVar3;
  Reason *this_00;
  vec<int> *this_01;
  Lit *pLVar4;
  Lit in_ESI;
  long in_RDI;
  Clause *c;
  Reason *r;
  undefined8 in_stack_ffffffffffffff98;
  int i;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  undefined4 uVar5;
  undefined4 in_stack_ffffffffffffffb8;
  Lit in_stack_ffffffffffffffc4;
  Clause *local_8;
  
  i = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  uVar2 = ::var(in_ESI);
  this_00 = vec<Reason>::operator[]((vec<Reason> *)(in_RDI + 0x60),uVar2);
  uVar2 = Reason::type(this_00);
  if (uVar2 == 0) {
    local_8 = Reason::pt(this_00);
  }
  else if (uVar2 == 1) {
    uVar5 = *(undefined4 *)(in_RDI + 0xf8);
    this_01 = (vec<int> *)(in_RDI + 0x70);
    index = ::var(in_ESI);
    vec<int>::operator[](this_01,index);
    btToPos((SAT *)CONCAT44(uVar5,in_stack_ffffffffffffffa0),(int)((ulong)this_01 >> 0x20),
            (int)this_01);
    local_8 = _getExpl((SAT *)CONCAT44(uVar2,in_stack_ffffffffffffffb8),in_stack_ffffffffffffffc4);
  }
  else {
    puVar1 = *(uint **)(in_RDI + 0x188);
    uVar2 = Reason::type(this_00);
    *puVar1 = *puVar1 & 0xff | uVar2 << 8;
    Reason::d1(this_00);
    LVar3 = toLit(0x28b142);
    pLVar4 = Clause::operator[]((Clause *)
                                CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),i);
    pLVar4->x = LVar3.x;
    if (*puVar1 >> 8 == 3) {
      Reason::d2(this_00);
      LVar3 = toLit(0x28b17b);
      pLVar4 = Clause::operator[]((Clause *)
                                  CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),i);
      pLVar4->x = LVar3.x;
    }
    local_8 = *(Clause **)(in_RDI + 0x188);
  }
  return local_8;
}

Assistant:

inline Clause* SAT::getExpl(Lit p) {
	const Reason& r = reason[var(p)];
	switch (r.type()) {
		case 0:
			return r.pt();
		case 1:
			btToPos(index, trailpos[var(p)]);
			return _getExpl(p);
		default:
			Clause& c = *short_expl;
			c.sz = r.type();
			c[1] = toLit(r.d1());
			if (c.sz == 3) {
				c[2] = toLit(r.d2());
			}
			return short_expl;
	}
}